

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testselectionwidget.cpp
# Opt level: O0

bool somethings_selected_proc(Am_Object *param_1)

{
  byte bVar1;
  ulong uVar2;
  Am_Value *pAVar3;
  undefined1 local_28 [8];
  Am_Value v;
  Am_Object *param_0_local;
  
  v.value = (anon_union_8_8_ea4c8939_for_value)param_1;
  uVar2 = Am_Object::Valid();
  if ((uVar2 & 1) == 0) {
    param_0_local._7_1_ = false;
  }
  else {
    Am_Value::Am_Value((Am_Value *)local_28);
    pAVar3 = (Am_Value *)Am_Object::Get(0xc678,0x169);
    Am_Value::operator=((Am_Value *)local_28,pAVar3);
    bVar1 = Am_Value::Valid();
    param_0_local._7_1_ = (bool)((bVar1 ^ 0xff) & 1);
    Am_Value::~Am_Value((Am_Value *)local_28);
  }
  return param_0_local._7_1_;
}

Assistant:

Am_Define_No_Self_Formula(bool, somethings_selected)
{
  if (my_selection.Valid()) {
    Am_Value v;
    v = my_selection.Get(Am_VALUE);
    return !v.Valid();
  } else
    return false;
}